

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall helics::TimeCoordinator::updateTimeGrant(TimeCoordinator *this)

{
  uint uVar1;
  undefined8 uVar2;
  SmallBuffer *pSVar3;
  undefined2 uVar4;
  ActionMessage *in_RDI;
  ActionMessage treq;
  GlobalFederateId local_d8 [4];
  undefined8 in_stack_ffffffffffffff38;
  Time in_stack_ffffffffffffff40;
  ActionMessage *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff5a;
  baseType bVar5;
  
  if (*(char *)((long)&in_RDI[3].Tdemin.internalTimeCode + 1) != '\x01') {
    *(pointer *)(in_RDI[1].payload.buffer._M_elems + 0x38) =
         in_RDI[1].stringData.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    uVar2 = *(undefined8 *)(in_RDI[1].payload.buffer._M_elems + 0x38);
    in_RDI[2].source_id = (GlobalFederateId)(int)uVar2;
    in_RDI[2].source_handle = (InterfaceHandle)(int)((ulong)uVar2 >> 0x20);
  }
  *(int *)((in_RDI->payload).buffer._M_elems + 0xc) =
       *(int *)((in_RDI->payload).buffer._M_elems + 0xc) + 1;
  ActionMessage::ActionMessage
            ((ActionMessage *)in_stack_ffffffffffffff40.internalTimeCode,
             (action_t)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  bVar5 = *(baseType *)(in_RDI[1].payload.buffer._M_elems + 0x38);
  uVar1 = *(uint *)((in_RDI->payload).buffer._M_elems + 0xc);
  uVar4 = (undefined2)uVar1;
  if ((uVar1 & 0xffff) != *(uint *)((in_RDI->payload).buffer._M_elems + 0xc)) {
    pSVar3 = &in_RDI->payload;
    (pSVar3->buffer)._M_elems[0xc] = 0;
    (pSVar3->buffer)._M_elems[0xd] = 0;
    (pSVar3->buffer)._M_elems[0xe] = 0;
    (pSVar3->buffer)._M_elems[0xf] = 0;
  }
  if (*(char *)((long)&in_RDI[3].Tdemin.internalTimeCode + 1) != '\0') {
    TimeDependencies::resetIteratingTimeRequests
              ((TimeDependencies *)
               in_RDI[1].stringData.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,in_stack_ffffffffffffff40);
  }
  in_RDI[1].Tdemin.internalTimeCode = bVar5;
  in_RDI[1].Tso.internalTimeCode = bVar5;
  *(baseType *)in_RDI[1].payload.buffer._M_elems = bVar5;
  in_RDI[1].payload.buffer._M_elems[0x20] = 5;
  local_d8[0].gid = 0;
  GlobalFederateId::GlobalFederateId(local_d8);
  transmitTimingMessages
            ((TimeCoordinator *)CONCAT62(in_stack_ffffffffffffff5a,uVar4),in_stack_ffffffffffffff50,
             (GlobalFederateId)(BaseType)((ulong)bVar5 >> 0x20));
  ActionMessage::~ActionMessage(in_RDI);
  return;
}

Assistant:

void TimeCoordinator::updateTimeGrant()
{
    if (iterating != IterationRequest::FORCE_ITERATION) {
        time_granted = time_exec;
        time_grantBase = time_granted;
    }
    ++sequenceCounter;
    ActionMessage treq(CMD_TIME_GRANT);
    treq.source_id = mSourceId;
    treq.actionTime = time_granted;
    treq.counter = sequenceCounter;
    if (static_cast<std::int32_t>(treq.counter) != sequenceCounter) {
        sequenceCounter = 0;
    }
    if (iterating != IterationRequest::NO_ITERATIONS) {
        dependencies.resetIteratingTimeRequests(time_exec);
    }
    lastSend.next = treq.actionTime;
    lastSend.Te = treq.actionTime;
    lastSend.minDe = treq.actionTime;
    lastSend.mTimeState = TimeState::time_granted;
    transmitTimingMessages(treq);
    // printf("%d GRANT allow=%f next=%f, exec=%f, Tdemin=%f\n", source_id,
    // static_cast<double>(time_allow), static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}